

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

double fitted(reg_object obj,double *inp,double *varcovar,double *var)

{
  size_t __size;
  double dVar1;
  double dVar2;
  uint n;
  double *C;
  double *A;
  double *B;
  double *C_00;
  reg_object prVar3;
  long lVar4;
  ulong uVar5;
  
  n = obj->p;
  C = (double *)malloc(8);
  __size = (long)(int)n * 8;
  A = (double *)malloc(__size);
  B = (double *)malloc(__size);
  C_00 = (double *)malloc(__size);
  if (obj->intercept == 1) {
    *A = 1.0;
    *B = obj->beta[0].value;
    prVar3 = obj + 1;
    for (lVar4 = 1; lVar4 < (int)n; lVar4 = lVar4 + 1) {
      A[lVar4] = inp[lVar4 + -1];
      B[lVar4] = *(double *)prVar3;
      prVar3 = (reg_object)&prVar3->sigma_upper;
    }
  }
  else {
    lVar4 = 0;
    uVar5 = 0;
    if (0 < (int)n) {
      uVar5 = (ulong)n;
    }
    for (; uVar5 * 8 != lVar4; lVar4 = lVar4 + 8) {
      *(undefined8 *)((long)A + lVar4) = *(undefined8 *)((long)inp + lVar4);
      *(undefined8 *)((long)B + lVar4) = *(undefined8 *)((long)&obj->beta[0].value + lVar4 * 4);
    }
  }
  mmult(A,B,C,1,n,1);
  dVar1 = *C;
  mmult(A,varcovar,C_00,1,n,n);
  mmult(C_00,A,C,1,n,1);
  dVar2 = *C;
  *var = dVar2;
  var[1] = dVar2 + obj->sigma;
  free(C_00);
  free(C);
  free(A);
  free(B);
  return dVar1;
}

Assistant:

double fitted(reg_object obj, double *inp, double *varcovar, double *var) {
	int i, p;
	double oup;
	double *y, *x0, *b, *temp;
	/*
	* The function predicts output value at a given input point (vector of size p-1)
	*
	* inp - ia a  vector of length p-1 values corresponding to each of the p-1
	* dependent variables.
	* The function returns output value corresponding to the input inp vector of length (p-1).
	*
	* varcovar - Is the Aurovariance-Covariance matrix that is obtained from the regression function
	* var - is a vector of length 2 where
	* var[0] - Variance of Mean Prediction
	* var[1] - Variance Of Individual Prediction
	*
	*/
	p = obj->p;
	y = (double*)malloc(sizeof(double) * 1);
	x0 = (double*)malloc(sizeof(double) * p);
	b = (double*)malloc(sizeof(double) * p);
	temp = (double*)malloc(sizeof(double) * p);

	if (obj->intercept == 1) {
		x0[0] = 1.0;

		b[0] = (obj->beta)->value;

		for (i = 1; i < p; ++i) {
			x0[i] = inp[i - 1];
			b[i] = (obj->beta + i)->value;
		}
	}
	else {

		for (i = 0; i < p; ++i) {
			x0[i] = inp[i];
			b[i] = (obj->beta + i)->value;
		}
	}


	// Output
	mmult(x0, b, y, 1, p, 1);
	oup = *y;

	// Variance Of Mean Prediction
	mmult(x0, varcovar, temp, 1, p, p);
	mmult(temp, x0, y, 1, p, 1);
	var[0] = *y;

	// Variance Of Individual prediction
	var[1] = obj->sigma + var[0];

	free(temp);
	free(y);
	free(x0);
	free(b);
	return oup;
}